

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

void __thiscall QToolBarLayout::updateMarginAndSpacing(QToolBarLayout *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  QWidget *this_00;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOptionToolBar opt;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (this_00 != (QWidget *)0x0) {
    pQVar4 = QWidget::style(this_00);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_88);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,local_88);
    iVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x37,local_88,this_00);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x34,local_88,this_00);
    iVar1 = iVar1 + iVar2;
    QLayout::setContentsMargins(&this->super_QLayout,iVar1,iVar1,iVar1,iVar1);
    uVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x36,local_88,this_00);
    (**(code **)(*(long *)&this->super_QLayout + 0x68))(this,uVar3);
    QStyleOption::~QStyleOption((QStyleOption *)local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::updateMarginAndSpacing()
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int margin = style->pixelMetric(QStyle::PM_ToolBarItemMargin, &opt, tb)
            + style->pixelMetric(QStyle::PM_ToolBarFrameWidth, &opt, tb);
    setContentsMargins(margin, margin, margin, margin);
    setSpacing(style->pixelMetric(QStyle::PM_ToolBarItemSpacing, &opt, tb));
}